

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O2

void embree::sphereIntersectFunc(RTCIntersectFunctionNArguments *args)

{
  float fVar1;
  float fVar2;
  int *piVar3;
  RTCRayHitN *pRVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  
  if ((args->N == 1) && (piVar3 = args->valid, *piVar3 != 0)) {
    pRVar4 = args->rayhit;
    fVar1 = (float)args->primID;
    pfVar5 = (float *)((ulong)(uint)fVar1 * 0x30 + (long)args->geometryUserPtr);
    *piVar3 = 0;
    fVar7 = *(float *)(pRVar4 + 0x10);
    fVar15 = *(float *)(pRVar4 + 0x14);
    fVar2 = *(float *)(pRVar4 + 0x18);
    fVar6 = *(float *)pRVar4 - *pfVar5;
    fVar8 = *(float *)(pRVar4 + 4) - pfVar5[1];
    fVar9 = *(float *)(pRVar4 + 8) - pfVar5[2];
    fVar12 = fVar15 * fVar15;
    fVar13 = fVar2 * fVar2;
    fVar14 = *(float *)(pRVar4 + 0x1c) * *(float *)(pRVar4 + 0x1c);
    fVar16 = fVar12 + fVar7 * fVar7 + fVar13;
    fVar17 = fVar12 + fVar12 + fVar14;
    fVar13 = fVar12 + fVar13 + fVar13;
    fVar14 = fVar12 + fVar14 + fVar14;
    fVar15 = fVar2 * fVar9 + fVar15 * fVar8 + fVar7 * fVar6;
    fVar15 = fVar15 + fVar15;
    fVar7 = fVar15 * fVar15 +
            fVar16 * -4.0 *
            ((fVar9 * fVar9 + fVar8 * fVar8 + fVar6 * fVar6) - pfVar5[4] * pfVar5[4]);
    if (0.0 <= fVar7) {
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      auVar10._4_4_ = fVar17;
      auVar10._0_4_ = fVar16;
      auVar10._8_4_ = fVar13;
      auVar10._12_4_ = fVar14;
      auVar11._4_4_ = fVar17;
      auVar11._0_4_ = fVar16;
      auVar11._8_4_ = fVar13;
      auVar11._12_4_ = fVar14;
      auVar11 = rcpss(auVar10,auVar11);
      fVar6 = (2.0 - fVar16 * auVar11._0_4_) * auVar11._0_4_ * 0.5;
      fVar8 = (-fVar15 - fVar7) * fVar6;
      fVar6 = (fVar7 - fVar15) * fVar6;
      fVar2 = pfVar5[8];
      fVar7 = *(float *)(pRVar4 + 0xc);
      fVar15 = *(float *)(pRVar4 + 0x20);
      if ((fVar7 < fVar8) && (fVar8 < fVar15)) {
        fVar7 = *pfVar5;
        fVar15 = pfVar5[1];
        fVar9 = pfVar5[2];
        *(float *)(pRVar4 + 0x20) = fVar8;
        *(ulong *)(pRVar4 + 0x30) =
             CONCAT44((fVar8 * *(float *)(pRVar4 + 0x14) + *(float *)(pRVar4 + 4)) - fVar15,
                      (fVar8 * *(float *)(pRVar4 + 0x10) + *(float *)pRVar4) - fVar7);
        *(float *)(pRVar4 + 0x38) =
             (fVar8 * *(float *)(pRVar4 + 0x18) + *(float *)(pRVar4 + 8)) - fVar9;
        *(undefined8 *)(pRVar4 + 0x3c) = 0;
        *(float *)(pRVar4 + 0x44) = fVar1;
        *(float *)(pRVar4 + 0x48) = fVar2;
        *piVar3 = -1;
        fVar7 = *(float *)(pRVar4 + 0xc);
        fVar15 = *(float *)(pRVar4 + 0x20);
      }
      if ((fVar7 < fVar6) && (fVar6 < fVar15)) {
        fVar7 = *pfVar5;
        fVar15 = pfVar5[1];
        fVar8 = pfVar5[2];
        *(float *)(pRVar4 + 0x20) = fVar6;
        *(ulong *)(pRVar4 + 0x30) =
             CONCAT44((fVar6 * *(float *)(pRVar4 + 0x14) + *(float *)(pRVar4 + 4)) - fVar15,
                      (fVar6 * *(float *)(pRVar4 + 0x10) + *(float *)pRVar4) - fVar7);
        *(float *)(pRVar4 + 0x38) =
             (fVar6 * *(float *)(pRVar4 + 0x18) + *(float *)(pRVar4 + 8)) - fVar8;
        *(undefined8 *)(pRVar4 + 0x3c) = 0;
        *(float *)(pRVar4 + 0x44) = fVar1;
        *(float *)(pRVar4 + 0x48) = fVar2;
        *piVar3 = -1;
      }
    }
  }
  return;
}

Assistant:

RTC_SYCL_INDIRECTLY_CALLABLE void sphereIntersectFunc(const RTCIntersectFunctionNArguments* args)
{
  int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  Ray *ray = (Ray*)args->rayhit;
  RTCHit* hit = (RTCHit *)&ray->Ng.x;
  unsigned int primID = args->primID;

  if (args->N != 1)
    return;
  const Sphere* spheres = (const Sphere*)ptr;
  const Sphere& sphere = spheres[primID];

  if (!valid[0]) return;
  valid[0] = 0;

  const Vec3fa v = ray->org-sphere.p;
  const float A = dot(ray->dir,ray->dir);
  const float B = 2.0f*dot(v,ray->dir);
  const float C = dot(v,v) - sqr(sphere.r);
  const float D = B*B - 4.0f*A*C;
  if (D < 0.0f) return;
  const float Q = sqrt(D);
  const float rcpA = rcp(A);
  const float t0 = 0.5f*rcpA*(-B-Q);
  const float t1 = 0.5f*rcpA*(-B+Q);

  RTCHit potentialHit;
  potentialHit.u = 0.0f;
  potentialHit.v = 0.0f;
  potentialHit.geomID = sphere.geomID;
  potentialHit.primID = primID;
  if ((ray->tnear() < t0) & (t0 < ray->tfar))
  {
    const Vec3fa Ng = ray->org+t0*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;
    ray->tfar = t0;
    *hit = potentialHit;
    valid[0] = -1;
  }

  if ((ray->tnear() < t1) & (t1 < ray->tfar))
  {
    const Vec3fa Ng = ray->org+t1*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;
    ray->tfar = t1;
    *hit = potentialHit;
    valid[0] = -1;
  }
}